

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone::load_1(xr_bone *this,xr_reader *r)

{
  size_t sVar1;
  float fVar2;
  unsigned_short local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_bone *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar1 = xr_reader::r_chunk<unsigned_short>(r,1,&local_1a);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x19,"void xray_re::xr_bone::load_1(xr_reader &)");
  }
  if (local_1a != 1 && local_1a != 2) {
    __assert_fail("version == BONE_VERSION_1 || version == BONE_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x1a,"void xray_re::xr_bone::load_1(xr_reader &)");
  }
  sVar1 = xr_reader::find_chunk(pxStack_18,2);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x1d,"void xray_re::xr_bone::load_1(xr_reader &)");
  }
  xr_reader::r_sz(pxStack_18,&this->m_name);
  xr_reader::r_sz(pxStack_18,&this->m_parent_name);
  xr_reader::r_sz(pxStack_18,&this->m_vmap_name);
  xr_reader::debug_find_chunk(pxStack_18);
  sVar1 = xr_reader::find_chunk(pxStack_18,3);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_bone.cxx"
                  ,0x24,"void xray_re::xr_bone::load_1(xr_reader &)");
  }
  xr_reader::r_fvector3(pxStack_18,&this->m_bind_offset);
  xr_reader::r_fvector3(pxStack_18,&this->m_bind_rotate);
  fVar2 = xr_reader::r_float(pxStack_18);
  this->m_bind_length = fVar2;
  xr_reader::debug_find_chunk(pxStack_18);
  if (local_1a == 1) {
    std::swap<float>((float *)&this->m_bind_offset,&(this->m_bind_offset).field_0.field_0.y);
  }
  load_data(this,pxStack_18);
  return;
}

Assistant:

void xr_bone::load_1(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(BONE_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == BONE_VERSION_1 || version == BONE_VERSION);

	if (!r.find_chunk(BONE_CHUNK_DEF))
		xr_not_expected();
	r.r_sz(m_name);
	r.r_sz(m_parent_name);
	r.r_sz(m_vmap_name);
	r.debug_find_chunk();

	if (!r.find_chunk(BONE_CHUNK_BIND_POSE))
		xr_not_expected();
	r.r_fvector3(m_bind_offset);
	r.r_fvector3(m_bind_rotate);
	m_bind_length = r.r_float();
	r.debug_find_chunk();
	if (version == BONE_VERSION_1)
		std::swap(m_bind_offset.x, m_bind_offset.y);

	load_data(r);
}